

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O0

void Bbr_bddPrint(DdManager *dd,DdNode *F)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int local_40;
  uint local_3c;
  int i;
  int fFirstCube;
  int nVars;
  double Value;
  int *Cube;
  DdGen *Gen;
  DdNode *F_local;
  DdManager *dd_local;
  
  iVar1 = dd->size;
  bVar2 = true;
  Gen = (DdGen *)F;
  F_local = &dd->sentinel;
  if (F == (DdNode *)0x0) {
    printf("NULL");
  }
  else if (F == (DdNode *)((ulong)dd->one ^ 1)) {
    printf("Constant 0");
  }
  else if (F == dd->one) {
    printf("Constant 1");
  }
  else {
    Cube = (int *)Cudd_FirstCube(dd,F,(int **)&Value,(double *)&fFirstCube);
    while( true ) {
      iVar3 = Cudd_IsGenEmpty((DdGen *)Cube);
      if (iVar3 == 0) {
        local_40 = 1;
      }
      else {
        local_40 = Cudd_GenFree((DdGen *)Cube);
      }
      if (local_40 == 0) break;
      if (bVar2) {
        bVar2 = false;
      }
      else {
        printf(" + ");
      }
      for (local_3c = 0; (int)local_3c < iVar1; local_3c = local_3c + 1) {
        if (*(int *)((long)Value + (long)(int)local_3c * 4) == 0) {
          printf("[%d]\'",(ulong)local_3c);
        }
        else if (*(int *)((long)Value + (long)(int)local_3c * 4) == 1) {
          printf("[%d]",(ulong)local_3c);
        }
      }
      Cudd_NextCube((DdGen *)Cube,(int **)&Value,(double *)&fFirstCube);
    }
  }
  return;
}

Assistant:

void Bbr_bddPrint( DdManager * dd, DdNode * F )
{
    DdGen * Gen;
    int * Cube;
    CUDD_VALUE_TYPE Value;
    int nVars = dd->size;
    int fFirstCube = 1;
    int i;

    if ( F == NULL )
    {
        printf("NULL");
        return;
    }
    if ( F == b0 )
    {
        printf("Constant 0");
        return;
    }
    if ( F == b1 )
    {
        printf("Constant 1");
        return;
    }

    Cudd_ForeachCube( dd, F, Gen, Cube, Value )
    {
        if ( fFirstCube )
            fFirstCube = 0;
        else
//          Output << " + ";
            printf( " + " );

        for ( i = 0; i < nVars; i++ )
            if ( Cube[i] == 0 )
                printf( "[%d]'", i );
//              printf( "%c'", (char)('a'+i) );
            else if ( Cube[i] == 1 )
                printf( "[%d]", i );
//              printf( "%c", (char)('a'+i) );
    }

//  printf("\n");
}